

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O1

void __thiscall QHttpSocketEngine::emitReadNotification(QHttpSocketEngine *this)

{
  long lVar1;
  long in_FS_OFFSET;
  void *local_28;
  char *pcStack_20;
  QMetaTypeInterface *local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (((*(char *)(lVar1 + 0x118) == '\x01') && (*(char *)(lVar1 + 0x11b) != '\x01')) ||
     (*(char *)(lVar1 + 0x11d) == '\x01')) {
    *(undefined1 *)(lVar1 + 0x11b) = 1;
    local_28 = (void *)0x0;
    pcStack_20 = (char *)0x0;
    local_18[0] = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodImpl
              ((QObject *)this,"emitPendingReadNotification",QueuedConnection,1,&local_28,
               &pcStack_20,local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpSocketEngine::emitReadNotification()
{
    Q_D(QHttpSocketEngine);
    // if there is a connection notification pending we have to emit the readNotification
    // in case there is connection error. This is only needed for Windows, but it does not
    // hurt in other cases.
    if ((d->readNotificationEnabled && !d->readNotificationPending) || d->connectionNotificationPending) {
        d->readNotificationPending = true;
        QMetaObject::invokeMethod(this, "emitPendingReadNotification", Qt::QueuedConnection);
    }
}